

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O0

int main(void)

{
  allocator<char> local_529;
  string local_528;
  allocator<char> local_501;
  string local_500;
  anon_class_1_0_00000001 local_4d9;
  functor_response local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  anon_class_1_0_00000001 local_489;
  functor_writer local_488;
  allocator<char> local_461;
  string local_460;
  anon_class_1_0_00000001 local_439;
  functor_string local_438;
  allocator<char> local_411;
  string local_410;
  anon_class_1_0_00000001 local_3e9;
  functor_writer local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  anon_class_1_0_00000001 local_399;
  functor_writer local_398;
  allocator<char> local_371;
  string local_370;
  anon_class_1_0_00000001 local_349;
  functor_string local_348;
  allocator<char> local_311;
  string local_310;
  undefined1 local_2f0 [8];
  server_t s;
  
  clask::server();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"/",&local_311);
  std::function<std::__cxx11::string(clask::request&)>::function<main::__0,void>
            ((function<std::__cxx11::string(clask::request&)> *)&local_348,&local_349);
  clask::server_t::GET((server_t *)local_2f0,&local_310,&local_348);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
  ::~function(&local_348);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"/notfound",&local_371);
  std::function<void(clask::response_writer&,clask::request&)>::function<main::__1,void>
            ((function<void(clask::response_writer&,clask::request&)> *)&local_398,&local_399);
  clask::server_t::GET((server_t *)local_2f0,&local_370,&local_398);
  std::function<void_(clask::response_writer_&,_clask::request_&)>::~function(&local_398);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"/foo",&local_3c1);
  std::function<void(clask::response_writer&,clask::request&)>::function<main::__2,void>
            ((function<void(clask::response_writer&,clask::request&)> *)&local_3e8,&local_3e9);
  clask::server_t::GET((server_t *)local_2f0,&local_3c0,&local_3e8);
  std::function<void_(clask::response_writer_&,_clask::request_&)>::~function(&local_3e8);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"/zoo/:name",&local_411);
  std::function<std::__cxx11::string(clask::request&)>::function<main::__3,void>
            ((function<std::__cxx11::string(clask::request&)> *)&local_438,&local_439);
  clask::server_t::GET((server_t *)local_2f0,&local_410,&local_438);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
  ::~function(&local_438);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator(&local_411);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,"/download",&local_461);
  std::function<void(clask::response_writer&,clask::request&)>::function<main::__4,void>
            ((function<void(clask::response_writer&,clask::request&)> *)&local_488,&local_489);
  clask::server_t::GET((server_t *)local_2f0,&local_460,&local_488);
  std::function<void_(clask::response_writer_&,_clask::request_&)>::~function(&local_488);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator(&local_461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,"/bar",&local_4b1);
  std::function<clask::response(clask::request&)>::function<main::__5,void>
            ((function<clask::response(clask::request&)> *)&local_4d8,&local_4d9);
  clask::server_t::GET((server_t *)local_2f0,&local_4b0,&local_4d8);
  std::function<clask::response_(clask::request_&)>::~function(&local_4d8);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"/static/",&local_501);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"./public",&local_529);
  clask::server_t::static_dir((server_t *)local_2f0,&local_500,&local_528,true);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  clask::server_t::run((server_t *)local_2f0,0x1f90);
  clask::server_t::~server_t((server_t *)local_2f0);
  return 0;
}

Assistant:

int main() {
  auto s = clask::server();
  s.GET("/", [](clask::request&) {
    return "OK!";
  });
  s.GET("/notfound", [](clask::response_writer& resp, clask::request&) {
    resp.code = 404;
    resp.set_header("content-type", "text/html");
    resp.write("Not Found");
  });
  s.GET("/foo", [](clask::response_writer& resp, clask::request&) {
    resp.set_header("content-type", "text/html");
    resp.write("he<b>l</b>lo");
    resp.end();
  });
  s.GET("/zoo/:name", [](clask::request& req) -> std::string {
    if (req.args.empty() || req.args[0].empty()) return "Wow!";
    return req.args[0];
  });
  s.GET("/download", [](clask::response_writer& resp, clask::request&) {
    resp.set_header("content-type", "application/octet-stream");
    resp.set_header("content-disposition", "attachment; filename=README.md");
    std::ifstream is("README.md", std::ios::in | std::ios::binary);
    char buf[BUFSIZ];
    while (!is.eof()) {
      auto size = is.read(buf, sizeof(buf)).gcount();
      resp.write(buf, (size_t) size);
    }
    resp.end();
  });
  s.GET("/bar", [](clask::request&) -> clask::response {
    return clask::response {
      .code = 200,
      .content = "hello",
      .headers = {
        { "X-Host", "hogehoge" },
      },
    };
  });
  s.static_dir("/static/", "./public", true);
  s.run();
}